

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFMatrix.cc
# Opt level: O0

void __thiscall QPDFMatrix::rotatex90(QPDFMatrix *this,int angle)

{
  QPDFMatrix local_a8;
  QPDFMatrix local_78;
  QPDFMatrix local_48;
  int local_14;
  QPDFMatrix *pQStack_10;
  int angle_local;
  QPDFMatrix *this_local;
  
  local_14 = angle;
  pQStack_10 = this;
  if (angle == 0x5a) {
    QPDFMatrix(&local_48,0.0,1.0,-1.0,0.0,0.0,0.0);
    concat(this,&local_48);
  }
  else if (angle == 0xb4) {
    QPDFMatrix(&local_78,-1.0,0.0,0.0,-1.0,0.0,0.0);
    concat(this,&local_78);
  }
  else if (angle == 0x10e) {
    QPDFMatrix(&local_a8,0.0,-1.0,1.0,0.0,0.0,0.0);
    concat(this,&local_a8);
  }
  return;
}

Assistant:

void
QPDFMatrix::rotatex90(int angle)
{
    switch (angle) {
    case 90:
        concat(QPDFMatrix(0, 1, -1, 0, 0, 0));
        break;
    case 180:
        concat(QPDFMatrix(-1, 0, 0, -1, 0, 0));
        break;
    case 270:
        concat(QPDFMatrix(0, -1, 1, 0, 0, 0));
        break;
    default:
        // ignore
        break;
    }
}